

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::append
          (region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t offset,uint64_t bytes_to_map)

{
  bool write_enabled;
  in_memory *file;
  element_type *peVar1;
  int line;
  pointer p_Var2;
  pointer psVar3;
  uint64_t uVar4;
  ulong uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  char *str;
  ulong uVar6;
  __allocator_type __a2;
  shared_ptr<pstore::memory_mapper_base> local_70;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::mock_mapper,_std::allocator<(anonymous_namespace)::mock_mapper>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_60;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> *local_50;
  ulong local_48;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  if (regions.ptr_ ==
      (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
       *)0x0) {
    str = "regions != nullptr";
    line = 0x7c;
  }
  else {
    uVar6 = this->minimum_size_;
    if (offset % uVar6 == 0) {
      uVar5 = (bytes_to_map + uVar6) - 1;
      uVar5 = uVar5 - uVar5 % uVar6;
      local_50 = this;
      if (uVar5 % uVar6 == 0) {
        while( true ) {
          if (uVar5 == 0) {
            psVar3 = ((regions.ptr_)->
                     super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar4 = 0;
            while( true ) {
              if (psVar3 == ((regions.ptr_)->
                            super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish) {
                return;
              }
              peVar1 = (psVar3->
                       super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              if (peVar1->offset_ != uVar4) break;
              uVar4 = uVar4 + peVar1->size_;
              psVar3 = psVar3 + 1;
            }
            assert_failed("region->offset () == p",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                          ,0xb4);
          }
          uVar6 = local_50->full_size_;
          if (uVar5 < local_50->full_size_) {
            uVar6 = uVar5;
          }
          local_48 = uVar5;
          if (uVar6 < local_50->minimum_size_) break;
          file = (local_50->file_).
                 super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          write_enabled = file->writable_;
          p_Var2 = (pointer)operator_new(0x88);
          local_60._M_alloc = &__a2;
          (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
          (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
          (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00258f50;
          local_60._M_ptr = p_Var2;
          in_memory_mapper::in_memory_mapper
                    ((in_memory_mapper *)&p_Var2->_M_impl,file,write_enabled,offset,uVar6);
          (p_Var2->_M_impl)._M_storage._M_storage.__align =
               (anon_struct_8_0_00000001_for___align)&PTR__mock_mapper_00258fa0;
          testing::internal::FunctionMocker<void_(void_*,_unsigned_long)>::FunctionMocker
                    ((FunctionMocker<void_(void_*,_unsigned_long)> *)
                     ((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30));
          local_60._M_ptr = (pointer)0x0;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::mock_mapper,_std::allocator<(anonymous_namespace)::mock_mapper>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr(&local_60);
          local_40 = 0;
          _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_70.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)&p_Var2->_M_impl;
          local_70.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
          std::
          vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
          ::emplace_back<std::shared_ptr<pstore::memory_mapper_base>>
                    ((vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
                      *)regions.ptr_,&local_70);
          uVar5 = local_48 - uVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_70.
                      super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
          offset = offset + local_50->full_size_;
        }
        assert_failed("size >= minimum_size_",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                      ,0xa2);
      }
      str = "bytes_to_map % minimum_size_ == 0";
      line = 0x7f;
    }
    else {
      str = "offset % minimum_size_ == 0";
      line = 0x7d;
    }
  }
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,line);
}

Assistant:

void region_builder<File, MemoryMapper>::append (gsl::not_null<container_type *> regions,
                                                         std::uint64_t offset,
                                                         std::uint64_t bytes_to_map) {
            PSTORE_ASSERT (regions != nullptr);
            PSTORE_ASSERT (offset % minimum_size_ == 0);
            bytes_to_map = round_up (bytes_to_map, minimum_size_);
            PSTORE_ASSERT (bytes_to_map % minimum_size_ == 0);

            // Zero or more regions whose size is a multiple of minimum-size but no
            // more than full-size.
            while (bytes_to_map > 0) {
                // Map no more than "full size" in one go.
                std::uint64_t const size = std::min (full_size_, bytes_to_map);

                bytes_to_map -= size;
                this->push (regions, bytes_to_map,
                            offset, // start of region
                            size);  // size of region
                offset += full_size_;
            }
            this->check_regions_are_contiguous (*regions);
        }